

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

bool __thiscall rw::PluginList::streamRead(PluginList *this,Stream *stream,void *object)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  bool bVar3;
  bool bVar4;
  int32 length;
  ChunkHeaderInfo header;
  uint32 local_3c;
  ChunkHeaderInfo local_38;
  
  bVar4 = false;
  bVar3 = findChunk(stream,3,&local_3c,(uint32 *)0x0);
  if (bVar3) {
    if (0 < (int)local_3c) {
      do {
        bVar3 = readChunkHeaderInfo(stream,&local_38);
        if (!bVar3) {
          return false;
        }
        local_3c = local_3c - 0xc;
        pLVar1 = (this->plugins).link.next;
        do {
          pLVar2 = pLVar1;
          if (pLVar2 == &(this->plugins).link) {
            (*stream->_vptr_Stream[5])(stream,(ulong)local_38.length,1);
            goto LAB_00110179;
          }
          pLVar1 = pLVar2->next;
        } while ((*(uint32 *)&pLVar2[-5].next != local_38.type) ||
                (pLVar2[-3].next == (LLLink *)0x0));
        (*(code *)pLVar2[-3].next)
                  (stream,local_38.length,object,*(undefined4 *)&pLVar2[-6].prev,
                   *(undefined4 *)((long)&pLVar2[-6].prev + 4));
LAB_00110179:
        local_3c = local_3c - local_38.length;
      } while (0 < (int)local_3c);
    }
    bVar4 = true;
    pLVar1 = (this->plugins).link.next;
    while (pLVar2 = pLVar1, pLVar2 != &(this->plugins).link) {
      pLVar1 = pLVar2->next;
      if (pLVar2[-1].next != (LLLink *)0x0) {
        (*(code *)pLVar2[-1].next)
                  (object,*(undefined4 *)&pLVar2[-6].prev,
                   *(undefined4 *)((long)&pLVar2[-6].prev + 4));
      }
    }
  }
  return bVar4;
}

Assistant:

bool
PluginList::streamRead(Stream *stream, void *object)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return false;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return false;
		length -= 12;
		FORLIST(lnk, this->plugins){
			Plugin *p = PLG(lnk);
			if(p->id == header.type && p->read){
				p->read(stream, header.length,
				        object, p->offset, p->size);
				goto cont;
			}
		}
		stream->seek(header.length);
cont:
		length -= header.length;
	}

	// now the always callbacks
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->alwaysCallback)
			p->alwaysCallback(object, p->offset, p->size);
	}
	return true;
}